

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo
          (cmNinjaTargetGenerator *this,string *lang,string *config)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *this_00;
  bool bVar2;
  Value *pVVar3;
  string *psVar4;
  cmGlobalNinjaGenerator *pcVar5;
  string *l_1;
  pointer pbVar6;
  _Any_data *this_01;
  string *i;
  pointer path;
  Value tdi;
  _Any_data local_388;
  code *local_378;
  code *local_370;
  cmNinjaTargetGenerator *local_368;
  undefined8 uStack_360;
  code *local_358;
  code *pcStack_350;
  string mod_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  LinkedTargetDirs linked_directories;
  string tdin;
  cmGeneratedFileStream tdif;
  _Any_data __tmp;
  
  Json::Value::Value(&tdi,objectValue);
  Json::Value::Value((Value *)&tdif,lang);
  pVVar3 = Json::Value::operator[](&tdi,"language");
  Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            ((string *)&local_388,(char (*) [7])0x72bb95,lang,(char (*) [13])0x730b69);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_388);
  Json::Value::Value((Value *)&tdif,psVar4);
  pVVar3 = Json::Value::operator[](&tdi,"compiler-id");
  Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  std::__cxx11::string::~string((string *)local_388._M_pod_data);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[13]>
            ((string *)&local_388,(char (*) [7])0x72bb95,lang,(char (*) [13])0x72225c);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_388);
  Json::Value::Value((Value *)&tdif,psVar4);
  pVVar3 = Json::Value::operator[](&tdi,"compiler-simulate-id");
  Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  std::__cxx11::string::~string((string *)local_388._M_pod_data);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[27]>
            ((string *)&local_388,(char (*) [7])0x72bb95,lang,
             (char (*) [27])"_COMPILER_FRONTEND_VARIANT");
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_388);
  Json::Value::Value((Value *)&tdif,psVar4);
  pVVar3 = Json::Value::operator[](&tdi,"compiler-frontend-variant");
  Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  std::__cxx11::string::~string((string *)local_388._M_pod_data);
  mod_dir._M_dataplus._M_p = (pointer)&mod_dir.field_2;
  mod_dir._M_string_length = 0;
  mod_dir.field_2._M_local_buf[0] = '\0';
  bVar2 = std::operator==(lang,"Fortran");
  if (bVar2) {
    this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar4 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&tdif,this_00,psVar4);
    this_01 = (_Any_data *)&tdif;
    std::__cxx11::string::operator=((string *)&mod_dir,(string *)this_01->_M_pod_data);
  }
  else {
    bVar2 = std::operator==(lang,"CXX");
    if (!bVar2) goto LAB_003bec8e;
    pcVar5 = GetGlobalGenerator(this);
    cmsys::SystemTools::CollapseFullPath
              ((string *)&local_388,
               &((this->super_cmCommonTargetGenerator).GeneratorTarget)->ObjectDirectory);
    (*(pcVar5->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x18])
              (&tdif,pcVar5,&local_388,config);
    std::__cxx11::string::operator=((string *)&mod_dir,(string *)&tdif);
    std::__cxx11::string::~string((string *)&tdif);
    this_01 = &local_388;
  }
  std::__cxx11::string::~string((string *)this_01->_M_pod_data);
LAB_003bec8e:
  if (mod_dir._M_string_length == 0) {
    cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile)
    ;
    std::__cxx11::string::_M_assign((string *)&mod_dir);
  }
  Json::Value::Value((Value *)&tdif,&mod_dir);
  pVVar3 = Json::Value::operator[](&tdi,"module-dir");
  Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  bVar2 = std::operator==(lang,"Fortran");
  if (bVar2) {
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_388._M_pod_data,"CMAKE_Fortran_SUBMODULE_SEP",
               (allocator<char> *)&linked_directories);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_388);
    Json::Value::Value((Value *)&tdif,psVar4);
    pVVar3 = Json::Value::operator[](&tdi,"submodule-sep");
    Json::Value::operator=(pVVar3,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
    std::__cxx11::string::~string((string *)local_388._M_pod_data);
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_388._M_pod_data,"CMAKE_Fortran_SUBMODULE_EXT",
               (allocator<char> *)&linked_directories);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_388);
    Json::Value::Value((Value *)&tdif,psVar4);
    pVVar3 = Json::Value::operator[](&tdi,"submodule-ext");
    Json::Value::operator=(pVVar3,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
    std::__cxx11::string::~string((string *)local_388._M_pod_data);
  }
  else {
    std::operator==(lang,"CXX");
  }
  psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar4);
  pVVar3 = Json::Value::operator[](&tdi,"dir-cur-bld");
  Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar4);
  pVVar3 = Json::Value::operator[](&tdi,"dir-cur-src");
  Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar4 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar4);
  pVVar3 = Json::Value::operator[](&tdi,"dir-top-bld");
  Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  psVar4 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdif,psVar4);
  pVVar3 = Json::Value::operator[](&tdi,"dir-top-src");
  Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar3 = Json::Value::operator[](&tdi,"include-dirs");
  pVVar3 = Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  includes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this->LocalGenerator,&includes,
             (this->super_cmCommonTargetGenerator).GeneratorTarget,lang,config);
  pbVar6 = includes.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (path = includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; path != pbVar6; path = path + 1) {
    psVar4 = ConvertToNinjaPath(this,path);
    Json::Value::Value((Value *)&tdif,psVar4);
    Json::Value::append(pVVar3,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
  }
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar3 = Json::Value::operator[](&tdi,"linked-target-dirs");
  pVVar3 = Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  cmCommonTargetGenerator::GetLinkedTargetDirectories
            (&linked_directories,&this->super_cmCommonTargetGenerator,lang,config);
  for (pbVar6 = linked_directories.Direct.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 != linked_directories.Direct.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    Json::Value::Value((Value *)&tdif,pbVar6);
    Json::Value::append(pVVar3,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
  }
  Json::Value::Value((Value *)&tdif,arrayValue);
  pVVar3 = Json::Value::operator[](&tdi,"forward-modules-from-target-dirs");
  pVVar3 = Json::Value::operator=(pVVar3,(Value *)&tdif);
  Json::Value::~Value((Value *)&tdif);
  for (pbVar6 = linked_directories.Forward.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 != linked_directories.Forward.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
    Json::Value::Value((Value *)&tdif,pbVar6);
    Json::Value::append(pVVar3,(Value *)&tdif);
    Json::Value::~Value((Value *)&tdif);
  }
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
  local_388._8_8_ = 0;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x0;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  local_368 = (cmNinjaTargetGenerator *)0x0;
  uStack_360 = 0;
  local_358 = (code *)0x0;
  pcStack_350 = (code *)0x0;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
  local_378 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2179:23)>
              ::_M_manager;
  local_370 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2179:23)>
              ::_M_invoke;
  local_388._M_unused._M_object = this;
  std::_Function_base::~_Function_base((_Function_base *)&tdif);
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)local_368;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = uStack_360;
  uStack_360 = 0;
  tdif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
  local_358 = std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2182:20)>
              ::_M_manager;
  pcStack_350 = std::
                _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cmSourceFile_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx:2182:20)>
                ::_M_invoke;
  local_368 = this;
  std::_Function_base::~_Function_base((_Function_base *)&tdif);
  cmDyndepCollation::AddCollationInformation
            (&tdi,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
             (cmDyndepGeneratorCallbacks *)&local_388);
  GetTargetDependInfoPath(&tdin,this,lang,config);
  cmGeneratedFileStream::cmGeneratedFileStream(&tdif,&tdin,false,None);
  Json::operator<<((OStream *)&tdif,&tdi);
  cmGeneratedFileStream::~cmGeneratedFileStream(&tdif);
  std::__cxx11::string::~string((string *)&tdin);
  cmDyndepGeneratorCallbacks::~cmDyndepGeneratorCallbacks((cmDyndepGeneratorCallbacks *)&local_388);
  cmCommonTargetGenerator::LinkedTargetDirs::~LinkedTargetDirs(&linked_directories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&includes);
  std::__cxx11::string::~string((string *)&mod_dir);
  Json::Value::~Value(&tdi);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang,
                                                   const std::string& config)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));
  tdi["compiler-simulate-id"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_SIMULATE_ID"));
  tdi["compiler-frontend-variant"] = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_FRONTEND_VARIANT"));

  std::string mod_dir;
  if (lang == "Fortran") {
    mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
  } else if (lang == "CXX") {
    mod_dir = this->GetGlobalGenerator()->ExpandCFGIntDir(
      cmSystemTools::CollapseFullPath(this->GeneratorTarget->ObjectDirectory),
      config);
  }
  if (mod_dir.empty()) {
    mod_dir = this->Makefile->GetCurrentBinaryDirectory();
  }
  tdi["module-dir"] = mod_dir;

  if (lang == "Fortran") {
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  } else if (lang == "CXX") {
    // No extra information necessary.
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, config);
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  auto const linked_directories =
    this->GetLinkedTargetDirectories(lang, config);
  for (std::string const& l : linked_directories.Direct) {
    tdi_linked_target_dirs.append(l);
  }

  Json::Value& tdi_forward_modules_from_target_dirs =
    tdi["forward-modules-from-target-dirs"] = Json::arrayValue;
  for (std::string const& l : linked_directories.Forward) {
    tdi_forward_modules_from_target_dirs.append(l);
  }

  cmDyndepGeneratorCallbacks cb;
  cb.ObjectFilePath = [this](cmSourceFile const* sf, std::string const& cnf) {
    return this->GetObjectFilePath(sf, cnf);
  };
  cb.BmiFilePath = [this](cmSourceFile const* sf, std::string const& cnf) {
    return this->GetBmiFilePath(sf, cnf);
  };

#if !defined(CMAKE_BOOTSTRAP)
  cmDyndepCollation::AddCollationInformation(tdi, this->GeneratorTarget,
                                             config, cb);
#endif

  std::string const tdin = this->GetTargetDependInfoPath(lang, config);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}